

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# storedenum.hpp
# Opt level: O2

bitset<256UL> * __thiscall
stored_bitfield::operator_cast_to_bitset
          (bitset<256UL> *__return_storage_ptr__,stored_bitfield *this)

{
  size_t __position;
  bitset<256UL> local_70;
  _Base_bitset<4UL> local_50;
  
  (__return_storage_ptr__->super__Base_bitset<4UL>)._M_w[2] = 0;
  (__return_storage_ptr__->super__Base_bitset<4UL>)._M_w[3] = 0;
  (__return_storage_ptr__->super__Base_bitset<4UL>)._M_w[0] = 0;
  (__return_storage_ptr__->super__Base_bitset<4UL>)._M_w[1] = 0;
  for (__position = 0; __position != 0x100; __position = __position + 8) {
    local_70.super__Base_bitset<4UL>._M_w[0] = (_WordT)(byte)*this;
    local_70.super__Base_bitset<4UL>._M_w[1] = 0;
    local_70.super__Base_bitset<4UL>._M_w[2] = 0;
    local_70.super__Base_bitset<4UL>._M_w[3] = 0;
    std::bitset<256UL>::operator<<((bitset<256UL> *)&local_50,&local_70,__position);
    std::_Base_bitset<4UL>::_M_do_or(&__return_storage_ptr__->super__Base_bitset<4UL>,&local_50);
    this = this + 1;
  }
  return __return_storage_ptr__;
}

Assistant:

operator std::bitset<size>() const {
		
		#define concat(a, b) a##b
		BOOST_STATIC_ASSERT(sizeof(base_type) <= sizeof(concat(unsi, gned) concat(lo, ng)));
		#undef concat
		
		std::bitset<size> result(0);
		for(size_t i = 0; i < count; i++) {
			result |= std::bitset<size>(bits[i]) << (i * base_size);
		}
		return result;
	}